

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O0

void bssl::ssl_maybe_shed_handshake_config(SSL *ssl)

{
  bool bVar1;
  pointer pSVar2;
  SSL *ssl_local;
  
  bVar1 = std::operator!=(&ssl->s3->hs,(nullptr_t)0x0);
  if ((((!bVar1) && (bVar1 = std::operator==(&ssl->config,(nullptr_t)0x0), !bVar1)) &&
      (pSVar2 = std::unique_ptr<bssl::SSL_CONFIG,_bssl::internal::Deleter>::operator->(&ssl->config)
      , (*(ushort *)&pSVar2->field_0x10d >> 7 & 1) != 0)) &&
     (bVar1 = ssl_can_renegotiate(ssl), !bVar1)) {
    std::unique_ptr<bssl::SSL_CONFIG,_bssl::internal::Deleter>::reset(&ssl->config,(pointer)0x0);
  }
  return;
}

Assistant:

static void ssl_maybe_shed_handshake_config(SSL *ssl) {
  if (ssl->s3->hs != nullptr ||               //
      ssl->config == nullptr ||               //
      !ssl->config->shed_handshake_config ||  //
      ssl_can_renegotiate(ssl)) {
    return;
  }

  ssl->config.reset();
}